

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O0

Req __thiscall
adios2::helper::CommImplDummy::Irecv
          (CommImplDummy *this,void *param_2,size_t param_3,Datatype param_4,int param_5,int param_6
          ,string *param_7)

{
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_> in_RDI;
  unique_ptr<adios2::helper::CommReqImplDummy,_std::default_delete<adios2::helper::CommReqImplDummy>_>
  req;
  pointer in_stack_ffffffffffffff88;
  CommReqImplDummy *in_stack_ffffffffffffff90;
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  *this_00;
  __uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  this_01;
  _Head_base<0UL,_adios2::helper::CommReqImplDummy_*,_false> in_stack_ffffffffffffffb8;
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  local_30 [6];
  
  this_01._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
       in_RDI._M_t.
       super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  operator_new(8);
  CommReqImplDummy::CommReqImplDummy(in_stack_ffffffffffffff90);
  this_00 = local_30;
  std::
  unique_ptr<adios2::helper::CommReqImplDummy,std::default_delete<adios2::helper::CommReqImplDummy>>
  ::unique_ptr<std::default_delete<adios2::helper::CommReqImplDummy>,void>
            ((unique_ptr<adios2::helper::CommReqImplDummy,_std::default_delete<adios2::helper::CommReqImplDummy>_>
              *)this_00,in_stack_ffffffffffffff88);
  std::unique_ptr<adios2::helper::CommReqImpl,std::default_delete<adios2::helper::CommReqImpl>>::
  unique_ptr<adios2::helper::CommReqImplDummy,std::default_delete<adios2::helper::CommReqImplDummy>,void>
            ((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
              *)this_01._M_t.
                super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
                .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl,
             (unique_ptr<adios2::helper::CommReqImplDummy,_std::default_delete<adios2::helper::CommReqImplDummy>_>
              *)&stack0xffffffffffffffb8);
  CommImpl::MakeReq((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
                     *)in_stack_ffffffffffffffb8._M_head_impl);
  std::unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>::
  ~unique_ptr(this_00);
  std::
  unique_ptr<adios2::helper::CommReqImplDummy,_std::default_delete<adios2::helper::CommReqImplDummy>_>
  ::~unique_ptr((unique_ptr<adios2::helper::CommReqImplDummy,_std::default_delete<adios2::helper::CommReqImplDummy>_>
                 *)this_00);
  return (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         )(unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
           )in_RDI._M_t.
            super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
            .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
}

Assistant:

Comm::Req CommImplDummy::Irecv(void *, size_t, Datatype, int, int, const std::string &) const
{
    auto req = std::unique_ptr<CommReqImplDummy>(new CommReqImplDummy());
    return MakeReq(std::move(req));
}